

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O0

TestNode *
deqp::gls::Functional::ScissorTestInternal::createPrimitiveTest
          (TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc,Vec4 *scissorArea,
          Vec4 *renderArea,PrimitiveType type,int primitiveCount)

{
  ScissorPrimitiveCase *this;
  Vec4 *renderArea_local;
  Vec4 *scissorArea_local;
  char *desc_local;
  char *name_local;
  RenderContext *renderCtx_local;
  TestContext *testCtx_local;
  
  this = (ScissorPrimitiveCase *)operator_new(0xa0);
  Functional::anon_unknown_0::ScissorPrimitiveCase::ScissorPrimitiveCase
            (this,testCtx,renderCtx,name,desc,scissorArea,renderArea,type,primitiveCount);
  return (TestNode *)this;
}

Assistant:

tcu::TestNode* createPrimitiveTest (tcu::TestContext&	testCtx,
									glu::RenderContext&	renderCtx,
									const char*			name,
									const char*			desc,
									const Vec4&			scissorArea,
									const Vec4&			renderArea,
									PrimitiveType		type,
									int					primitiveCount)
{
	return new ScissorPrimitiveCase(testCtx, renderCtx, name, desc, scissorArea, renderArea, type, primitiveCount);
}